

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void ucnv_setFromUCallBack_63
               (UConverter *converter,UConverterFromUCallback newAction,void *newContext,
               UConverterFromUCallback *oldAction,void **oldContext,UErrorCode *err)

{
  if (U_ZERO_ERROR < *err) {
    return;
  }
  if (oldAction != (UConverterFromUCallback *)0x0) {
    *oldAction = converter->fromUCharErrorBehaviour;
  }
  converter->fromUCharErrorBehaviour = newAction;
  if (oldContext != (void **)0x0) {
    *oldContext = converter->fromUContext;
  }
  converter->fromUContext = newContext;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }